

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderControlStatementTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Performance::ConditionalCase::init(ConditionalCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_> *this_00;
  PerfCaseType PVar1;
  DecisionType DVar2;
  BranchResult BVar3;
  pointer pfVar4;
  int iVar5;
  ostream *poVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  AttribSpec *__args;
  string *this_01;
  ostringstream *poVar12;
  ostringstream *stream;
  char *__rhs;
  float fVar13;
  string condition;
  ostringstream vtx;
  ostringstream frag;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  Vec4 local_3d8;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  AttribSpec local_3a0;
  undefined1 *local_340;
  undefined8 local_338;
  undefined1 local_330 [16];
  ostream local_320;
  ostream local_1a8;
  
  PVar1 = (this->super_ControlStatementCase).super_ShaderPerformanceCase.m_caseType;
  DVar2 = this->m_decisionType;
  BVar3 = this->m_branchType;
  pcVar7 = "-1.0";
  if (BVar3 == BRANCH_TRUE) {
    pcVar7 = "1.0";
  }
  pcVar10 = "v_compareValue";
  if (PVar1 == CASETYPE_VERTEX) {
    pcVar10 = "a_compareValue";
  }
  __rhs = "u_compareValue";
  if (DVar2 != DECISION_UNIFORM) {
    __rhs = pcVar10;
  }
  if (DVar2 == DECISION_STATIC) {
    __rhs = pcVar7;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  stream = (ostringstream *)&local_1a8;
  if (PVar1 == CASETYPE_VERTEX) {
    stream = (ostringstream *)&local_320;
  }
  std::operator<<(&local_320,"attribute highp vec4 a_position;\n");
  std::operator<<(&local_320,"attribute mediump vec4 a_value0;\n");
  std::operator<<(&local_320,"attribute mediump vec4 a_value1;\n");
  if (DVar2 - DECISION_UNIFORM < 2) {
    pcVar7 = "uniform mediump float u_compareValue;\n";
    poVar12 = stream;
    if (DVar2 == DECISION_ATTRIBUTE) {
      pcVar7 = "attribute mediump float a_compareValue;\n";
      poVar12 = (ostringstream *)&local_320;
    }
    std::operator<<((ostream *)poVar12,pcVar7);
  }
  if (PVar1 == CASETYPE_VERTEX) {
    pcVar7 = "varying mediump vec4 v_color;\n";
    std::operator<<(&local_320,"varying mediump vec4 v_color;\n");
LAB_00f2cde7:
    std::operator<<(&local_1a8,pcVar7);
  }
  else {
    std::operator<<(&local_320,"varying mediump vec4 v_value0;\n");
    std::operator<<(&local_320,"varying mediump vec4 v_value1;\n");
    std::operator<<(&local_1a8,"varying mediump vec4 v_value0;\n");
    std::operator<<(&local_1a8,"varying mediump vec4 v_value1;\n");
    if (DVar2 == DECISION_ATTRIBUTE) {
      pcVar7 = "varying mediump float v_compareValue;\n";
      std::operator<<(&local_320,"varying mediump float v_compareValue;\n");
      goto LAB_00f2cde7;
    }
  }
  std::operator<<(&local_320,"\n");
  std::operator<<(&local_320,"void main()\n");
  std::operator<<(&local_320,"{\n");
  std::operator<<(&local_320,"\tgl_Position = a_position;\n");
  std::operator<<(&local_1a8,"\n");
  std::operator<<(&local_1a8,"void main()\n");
  std::operator<<(&local_1a8,"{\n");
  std::operator<<((ostream *)stream,"\tmediump vec4 res;\n");
  local_340 = local_330;
  local_338 = 0;
  local_330[0] = 0;
  if (PVar1 == CASETYPE_VERTEX || BVar3 != BRANCH_MIXED) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_418,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)local_3c8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418,
                   __rhs);
    std::operator+(&local_3a0.name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8,
                   " > 0.0");
    std::__cxx11::string::operator=((string *)&local_340,(string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)local_3f8);
    this_01 = (string *)local_418;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3c8,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&local_3d8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,
                   "fract(");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418,
                   __rhs);
    std::operator+(&local_3a0.name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8,
                   ") < 0.5");
    std::__cxx11::string::operator=((string *)&local_340,(string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)local_3f8);
    std::__cxx11::string::~string((string *)local_418);
    this_01 = (string *)local_3c8;
  }
  std::__cxx11::string::~string(this_01);
  poVar6 = std::operator<<((ostream *)stream,"\tif (");
  poVar6 = std::operator<<(poVar6,(string *)&local_340);
  std::operator<<(poVar6,")\n");
  std::operator<<((ostream *)stream,"\t{\n");
  std::operator<<((ostream *)stream,"\t\t");
  pcVar7 = "v_value0";
  if (this->m_workloadDivision < WORKLOAD_DIVISION_FALSE_HEAVY) {
    if (PVar1 == CASETYPE_VERTEX) {
      pcVar7 = "a_value0";
    }
    writeConditionalWorkload((ostringstream *)stream,"res",pcVar7);
  }
  else {
    poVar6 = std::operator<<((ostream *)stream,"res = ");
    if (PVar1 == CASETYPE_VERTEX) {
      pcVar7 = "a_value0";
    }
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::operator<<(poVar6,";");
  }
  std::operator<<((ostream *)stream,"\n");
  std::operator<<((ostream *)stream,"\t}\n");
  std::operator<<((ostream *)stream,"\telse\n");
  std::operator<<((ostream *)stream,"\t{\n");
  std::operator<<((ostream *)stream,"\t\t");
  pcVar7 = "v_value1";
  if ((this->m_workloadDivision & ~WORKLOAD_DIVISION_FALSE_HEAVY) == WORKLOAD_DIVISION_EVEN) {
    if (PVar1 == CASETYPE_VERTEX) {
      pcVar7 = "a_value1";
    }
    writeConditionalWorkload((ostringstream *)stream,"res",pcVar7);
  }
  else {
    poVar6 = std::operator<<((ostream *)stream,"res = ");
    if (PVar1 == CASETYPE_VERTEX) {
      pcVar7 = "a_value1";
    }
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::operator<<(poVar6,";");
  }
  std::operator<<((ostream *)stream,"\n");
  std::operator<<((ostream *)stream,"\t}\n");
  if (PVar1 == CASETYPE_VERTEX) {
    std::operator<<(&local_320,"\tv_color = res;\n");
    pcVar7 = "\tgl_FragColor = v_color;\n";
  }
  else {
    if (DVar2 == DECISION_ATTRIBUTE) {
      std::operator<<(&local_320,"\tv_compareValue = a_compareValue;\n");
    }
    std::operator<<(&local_320,"\tv_value0 = a_value0;\n");
    std::operator<<(&local_320,"\tv_value1 = a_value1;\n");
    pcVar7 = "\tgl_FragColor = res;\n";
  }
  std::operator<<(&local_1a8,pcVar7);
  std::operator<<(&local_320,"}\n");
  std::operator<<(&local_1a8,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_vertShaderSource,
             (string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_fragShaderSource,
             (string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  if (DVar2 == DECISION_ATTRIBUTE) {
    if (BVar3 == BRANCH_MIXED) {
      if (PVar1 == CASETYPE_VERTEX) {
        std::vector<float,_std::allocator<float>_>::resize
                  (&this->m_comparisonValueArray,
                   (long)(((this->super_ControlStatementCase).super_ShaderPerformanceCase.m_measurer
                           .m_gridSizeX * 4 + 4) *
                         ((this->super_ControlStatementCase).super_ShaderPerformanceCase.m_measurer.
                          m_gridSizeY + 1)));
        pfVar4 = (this->m_comparisonValueArray).super__Vector_base<float,_std::allocator<float>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar8 = (ulong)((long)(this->m_comparisonValueArray).
                              super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pfVar4) >> 2;
        uVar11 = 0;
        uVar9 = uVar8 & 0xffffffff;
        if ((int)uVar8 < 1) {
          uVar9 = uVar11;
        }
        for (; uVar9 != uVar11; uVar11 = uVar11 + 1) {
          fVar13 = 0.0;
          if ((uVar11 & 3) == 0) {
            fVar13 = *(float *)(&DAT_01814830 + (ulong)((uVar11 & 4) == 0) * 4);
          }
          pfVar4[uVar11] = fVar13;
        }
        goto LAB_00f2d367;
      }
      local_418._0_4_ =
           (float)(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_measurer.
                  m_viewportWidth * 0.5;
      local_418._4_4_ = 0.0;
      fStack_410 = 0.0;
      fStack_40c = 0.0;
      local_3f8._0_4_ = 0.0;
      local_3f8._4_4_ = 0.0;
      fStack_3f0 = 0.0;
      fStack_3ec = 0.0;
      local_3d8.m_data[1] = 0.0;
      local_3d8.m_data[2] = 0.0;
      local_3c8._0_4_ = 0.0;
      local_3c8._4_4_ = 0.0;
      fStack_3c0 = 0.0;
      fStack_3bc = 0.0;
      local_3d8.m_data[3] = 0.0;
      local_3d8.m_data[0] = (float)local_418._0_4_;
      deqp::gls::AttribSpec::AttribSpec
                (&local_3a0,"a_compareValue",(Vec4 *)local_3f8,(Vec4 *)local_418,(Vec4 *)local_3c8,
                 &local_3d8);
      std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
      emplace_back<deqp::gls::AttribSpec>
                (&(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes,
                 &local_3a0);
    }
    else {
      local_418._0_4_ = *(undefined4 *)(&DAT_01814830 + (ulong)(BVar3 == BRANCH_TRUE) * 4);
      local_3f8._4_4_ = 0.0;
      fStack_3f0 = 0.0;
      fStack_3ec = 0.0;
      local_418._4_4_ = 0.0;
      fStack_410 = 0.0;
      fStack_40c = 0.0;
      local_3c8._4_4_ = 0.0;
      fStack_3c0 = 0.0;
      fStack_3bc = 0.0;
      local_3d8.m_data[1] = 0.0;
      local_3d8.m_data[2] = 0.0;
      local_3d8.m_data[3] = 0.0;
      local_3f8._0_4_ = local_418._0_4_;
      local_3d8.m_data[0] = (float)local_418._0_4_;
      local_3c8._0_4_ = local_418._0_4_;
      deqp::gls::AttribSpec::AttribSpec
                (&local_3a0,"a_compareValue",(Vec4 *)local_3f8,(Vec4 *)local_418,(Vec4 *)local_3c8,
                 &local_3d8);
      std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
      emplace_back<deqp::gls::AttribSpec>
                (&(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes,
                 &local_3a0);
    }
    std::__cxx11::string::~string((string *)&local_3a0);
  }
LAB_00f2d367:
  local_3f8._0_4_ = 0.0;
  local_3f8._4_4_ = 0.1;
  fStack_3f0 = 0.2;
  fStack_3ec = 0.3;
  local_418._0_4_ = 0.4;
  local_418._4_4_ = 0.5;
  fStack_410 = 0.6;
  fStack_40c = 0.7;
  local_3c8._0_4_ = 0.8;
  local_3c8._4_4_ = 0.9;
  fStack_3c0 = 1.0;
  fStack_3bc = 1.1;
  local_3d8.m_data[0] = 1.2;
  local_3d8.m_data[1] = 1.3;
  local_3d8.m_data[2] = 1.4;
  local_3d8.m_data[3] = 1.5;
  deqp::gls::AttribSpec::AttribSpec
            (&local_3a0,"a_value0",(Vec4 *)local_3f8,(Vec4 *)local_418,(Vec4 *)local_3c8,&local_3d8)
  ;
  this_00 = &(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes;
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
  emplace_back<deqp::gls::AttribSpec>(this_00,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  local_3f8._0_4_ = 0.0;
  local_3f8._4_4_ = 0.1;
  fStack_3f0 = 0.2;
  fStack_3ec = 0.3;
  local_418._0_4_ = 0.4;
  local_418._4_4_ = 0.5;
  fStack_410 = 0.6;
  fStack_40c = 0.7;
  local_3c8._0_4_ = 0.8;
  local_3c8._4_4_ = 0.9;
  fStack_3c0 = 1.0;
  fStack_3bc = 1.1;
  local_3d8.m_data[0] = 1.2;
  local_3d8.m_data[1] = 1.3;
  local_3d8.m_data[2] = 1.4;
  local_3d8.m_data[3] = 1.5;
  deqp::gls::AttribSpec::AttribSpec
            (&local_3a0,"a_value1",(Vec4 *)local_3f8,(Vec4 *)local_418,(Vec4 *)local_3c8,&local_3d8)
  ;
  __args = &local_3a0;
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
  emplace_back<deqp::gls::AttribSpec>(this_00,__args);
  std::__cxx11::string::~string((string *)&local_3a0);
  ControlStatementCase::init(&this->super_ControlStatementCase,(EVP_PKEY_CTX *)__args);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  iVar5 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
  return iVar5;
}

Assistant:

void ConditionalCase::init (void)
{
	bool			isVertexCase		= m_caseType == CASETYPE_VERTEX;

	bool			isStaticCase		= m_decisionType == DECISION_STATIC;
	bool			isUniformCase		= m_decisionType == DECISION_UNIFORM;
	bool			isAttributeCase		= m_decisionType == DECISION_ATTRIBUTE;

	DE_ASSERT(isStaticCase || isUniformCase || isAttributeCase);

	bool			isConditionTrue		= m_branchType == BRANCH_TRUE;
	bool			isConditionFalse	= m_branchType == BRANCH_FALSE;
	bool			isConditionMixed	= m_branchType == BRANCH_MIXED;

	DE_ASSERT(isConditionTrue || isConditionFalse || isConditionMixed);
	DE_UNREF(isConditionFalse);

	DE_ASSERT(isAttributeCase || !isConditionMixed); // The branch taken can vary between executions only if using attribute input.

	const char*		staticCompareValueStr	= isConditionTrue	? "1.0" : "-1.0";
	const char*		compareValueStr			= isStaticCase		? staticCompareValueStr :
											  isUniformCase		? "u_compareValue" :
											  isVertexCase		? "a_compareValue" :
																  "v_compareValue";

	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op		= isVertexCase ? vtx : frag;

	vtx << "attribute highp vec4 a_position;\n";	// Position attribute.
	vtx << "attribute mediump vec4 a_value0;\n";	// Input for workload calculations of "true" branch.
	vtx << "attribute mediump vec4 a_value1;\n";	// Input for workload calculations of "false" branch.

	// Value to be used in the conditional expression.
	if (isAttributeCase)
		vtx << "attribute mediump float a_compareValue;\n";
	else if (isUniformCase)
		op << "uniform mediump float u_compareValue;\n";

	// Varyings.
	if (isVertexCase)
	{
		vtx << "varying mediump vec4 v_color;\n";
		frag << "varying mediump vec4 v_color;\n";
	}
	else
	{
		vtx << "varying mediump vec4 v_value0;\n";
		vtx << "varying mediump vec4 v_value1;\n";
		frag << "varying mediump vec4 v_value0;\n";
		frag << "varying mediump vec4 v_value1;\n";

		if (isAttributeCase)
		{
			vtx << "varying mediump float v_compareValue;\n";
			frag << "varying mediump float v_compareValue;\n";
		}
	}

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";
	vtx << "	gl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	op << "	mediump vec4 res;\n";

	string condition;

	if (isConditionMixed && !isVertexCase)
		condition = string("") + "fract(" + compareValueStr + ") < 0.5"; // Comparison result varies with high frequency.
	else
		condition = string("") + compareValueStr + " > 0.0";

	op << "	if (" << condition << ")\n";
	op << "	{\n";

	op << "\t\t";
	if (m_workloadDivision == WORKLOAD_DIVISION_EVEN || m_workloadDivision == WORKLOAD_DIVISION_TRUE_HEAVY)
		writeConditionalWorkload(op, "res", isVertexCase ? "a_value0" : "v_value0"); // Workload calculation for the "true" branch.
	else
		op << "res = " << (isVertexCase ? "a_value0" : "v_value0") << ";";
	op << "\n";

	op << "	}\n";
	op << "	else\n";
	op << "	{\n";

	op << "\t\t";
	if (m_workloadDivision == WORKLOAD_DIVISION_EVEN || m_workloadDivision == WORKLOAD_DIVISION_FALSE_HEAVY)
		writeConditionalWorkload(op, "res", isVertexCase ? "a_value1" : "v_value1"); // Workload calculations for the "false" branch.
	else
		op << "res = " << (isVertexCase ? "a_value1" : "v_value1") << ";";
	op << "\n";

	op << "	}\n";

	if (isVertexCase)
	{
		// Put result to color variable.
		vtx << "	v_color = res;\n";
		frag << "	gl_FragColor = v_color;\n";
	}
	else
	{
		// Transfer inputs to fragment shader through varyings.
		if (isAttributeCase)
			vtx << "	v_compareValue = a_compareValue;\n";
		vtx << "	v_value0 = a_value0;\n";
		vtx << "	v_value1 = a_value1;\n";

		frag << "	gl_FragColor = res;\n"; // Put result to color variable.
	}

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource = vtx.str();
	m_fragShaderSource = frag.str();

	if (isAttributeCase)
	{
		if (!isConditionMixed)
		{
			// Every execution takes the same branch.

			float value = isConditionTrue ? +1.0f : -1.0f;
			m_attributes.push_back(AttribSpec("a_compareValue",	Vec4(value, 0.0f, 0.0f, 0.0f),
																Vec4(value, 0.0f, 0.0f, 0.0f),
																Vec4(value, 0.0f, 0.0f, 0.0f),
																Vec4(value, 0.0f, 0.0f, 0.0f)));
		}
		else if (isVertexCase)
		{
			// Vertex case, not every execution takes the same branch.

			const int	numComponents	= 4;
			int			numVertices		= (getGridWidth() + 1) * (getGridHeight() + 1);

			// setupProgram() will later bind this array as an attribute.
			m_comparisonValueArray.resize(numVertices * numComponents);

			// Make every second vertex take the true branch, and every second the false branch.
			for (int i = 0; i < (int)m_comparisonValueArray.size(); i++)
			{
				if (i % numComponents == 0)
					m_comparisonValueArray[i] = (i / numComponents) % 2 == 0 ? +1.0f : -1.0f;
				else
					m_comparisonValueArray[i] = 0.0f;
			}
		}
		else // isConditionMixed && !isVertexCase
		{
			// Fragment case, not every execution takes the same branch.
			// \note fract(a_compareValue) < 0.5 will be true for every second column of fragments.

			float minValue = 0.0f;
			float maxValue = (float)getViewportWidth()*0.5f;
			m_attributes.push_back(AttribSpec("a_compareValue",	Vec4(minValue, 0.0f, 0.0f, 0.0f),
																Vec4(maxValue, 0.0f, 0.0f, 0.0f),
																Vec4(minValue, 0.0f, 0.0f, 0.0f),
																Vec4(maxValue, 0.0f, 0.0f, 0.0f)));
		}
	}

	m_attributes.push_back(AttribSpec("a_value0",	Vec4(0.0f, 0.1f, 0.2f, 0.3f),
													Vec4(0.4f, 0.5f, 0.6f, 0.7f),
													Vec4(0.8f, 0.9f, 1.0f, 1.1f),
													Vec4(1.2f, 1.3f, 1.4f, 1.5f)));

	m_attributes.push_back(AttribSpec("a_value1",	Vec4(0.0f, 0.1f, 0.2f, 0.3f),
													Vec4(0.4f, 0.5f, 0.6f, 0.7f),
													Vec4(0.8f, 0.9f, 1.0f, 1.1f),
													Vec4(1.2f, 1.3f, 1.4f, 1.5f)));

	ControlStatementCase::init();
}